

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu.cpp
# Opt level: O0

int __thiscall ncnn::PReLU::load_model(PReLU *this,ModelBin *mb)

{
  bool bVar1;
  long *in_RSI;
  long in_RDI;
  Mat *m;
  Mat *in_stack_ffffffffffffff98;
  Mat local_58;
  int local_4;
  
  m = &local_58;
  (**(code **)(*in_RSI + 0x10))(m,in_RSI,*(undefined4 *)(in_RDI + 0xb8),1);
  Mat::operator=(in_stack_ffffffffffffff98,m);
  Mat::~Mat((Mat *)0x15425b);
  bVar1 = Mat::empty(m);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int PReLU::load_model(const ModelBin& mb)
{
    slope_data = mb.load(num_slope, 1);
    if (slope_data.empty())
        return -100;

    return 0;
}